

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O0

void __thiscall features::truncate_to(features *this,size_t i)

{
  float *pfVar1;
  unsigned_long *puVar2;
  float **ppfVar3;
  unsigned_long **ppuVar4;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  **ppsVar5;
  long in_RSI;
  v_array<float> *in_RDI;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  features *in_stack_ffffffffffffffd0;
  
  ppfVar3 = v_array<float>::begin(in_RDI);
  pfVar1 = *ppfVar3;
  ppfVar3 = v_array<float>::end(in_RDI);
  *ppfVar3 = pfVar1 + in_RSI;
  ppuVar4 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(in_RDI + 1));
  puVar2 = *ppuVar4;
  ppuVar4 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 1));
  if (puVar2 != *ppuVar4) {
    ppuVar4 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 1));
    in_stack_ffffffffffffffd0 = (features *)(*ppuVar4 + in_RSI);
    ppuVar4 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(in_RDI + 1));
    *ppuVar4 = (unsigned_long *)in_stack_ffffffffffffffd0;
  }
  ppsVar5 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(in_RDI + 2));
  psVar6 = *ppsVar5;
  ppsVar5 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(in_RDI + 2));
  if (psVar6 != *ppsVar5) {
    free_space_names(in_stack_ffffffffffffffd0,(size_t)psVar6);
    ppsVar5 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(in_RDI + 2));
    psVar6 = *ppsVar5;
    ppsVar5 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(in_RDI + 2));
    *ppsVar5 = psVar6 + in_RSI;
  }
  return;
}

Assistant:

void truncate_to(size_t i)
  {
    values.end() = values.begin() + i;
    if (indicies.end() != indicies.begin())
      indicies.end() = indicies.begin() + i;
    if (space_names.begin() != space_names.end())
    {
      free_space_names(i);
      space_names.end() = space_names.begin() + i;
    }
  }